

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-cave.c
# Opt level: O0

_Bool do_cmd_tunnel_aux(loc_conflict grid)

{
  undefined1 uVar1;
  int iVar2;
  bool bVar3;
  chunk_conflict *c;
  player *p;
  _Bool _Var4;
  _Bool _Var5;
  _Bool _Var6;
  wchar_t slot;
  uint32_t uVar7;
  object *poVar8;
  feature *pfVar9;
  char *pcVar10;
  char *local_198;
  char *local_190;
  char *with_clause;
  wchar_t dig_idx;
  wchar_t oldn;
  player_state *used_state;
  player_state local_state;
  object *best_digger;
  object *current_weapon;
  wchar_t weapon_slot;
  _Bool digger_swapped;
  _Bool rubble;
  _Bool gold;
  _Bool okay;
  wchar_t chance;
  wchar_t digging_chances [5];
  _Bool more;
  loc_conflict grid_local;
  
  grid_local.x._3_1_ = false;
  _Var4 = square_hasgoldvein((chunk *)cave,grid);
  _Var5 = square_isrubble((chunk *)cave,grid);
  bVar3 = false;
  slot = slot_by_name(player,"weapon");
  poVar8 = slot_object(player,slot);
  local_state.el_info[0x17].res_level = 0;
  local_state.el_info[0x17].flags = '\0';
  local_state.el_info[0x17]._3_1_ = 0;
  local_state.el_info[0x18].res_level = 0;
  local_state.el_info[0x18].flags = '\0';
  local_state.el_info[0x18]._3_1_ = 0;
  _dig_idx = &player->state;
  uVar1 = 1;
  local_190 = "with your weapon";
  if (poVar8 == (object *)0x0) {
    local_190 = "with your hands";
  }
  _Var6 = do_cmd_tunnel_test(player,grid);
  if (_Var6) {
    local_state.el_info._92_8_ = player_best_digger(player,false);
    if (((object *)local_state.el_info._92_8_ != poVar8) &&
       ((poVar8 == (object *)0x0 || (_Var6 = obj_can_takeoff(poVar8), _Var6)))) {
      bVar3 = true;
      local_190 = "with your swap digger";
      if (local_state.el_info._92_8_ != 0) {
        uVar1 = *(undefined1 *)(local_state.el_info._92_8_ + 0x11a);
        *(undefined1 *)(local_state.el_info._92_8_ + 0x11a) = 1;
      }
      (player->body).slots[slot].obj = (object *)local_state.el_info._92_8_;
      memcpy(&used_state,&player->state,0x120);
      calc_bonuses(player,(player_state_conflict *)&used_state,false,true);
      _dig_idx = (player_state_conflict *)&used_state;
    }
    calc_digging_chances(_dig_idx,(int *)&digger_swapped);
    with_clause._0_4_ = square_digging((chunk *)cave,grid);
    if (((wchar_t)with_clause < L'\x01') || (L'\x05' < (wchar_t)with_clause)) {
      pfVar9 = square_feat((chunk *)cave,grid);
      if (pfVar9->name == (char *)0x0) {
        pfVar9 = square_feat((chunk *)cave,grid);
        local_198 = format("Terrain index %d",(ulong)(uint)pfVar9->fidx);
      }
      else {
        pfVar9 = square_feat((chunk *)cave,grid);
        local_198 = pfVar9->name;
      }
      msg("%s has misconfigured digging chance; please report this bug.",local_198);
      with_clause._0_4_ = L'\x04';
    }
    iVar2 = *(int *)(&digger_swapped + (long)((wchar_t)with_clause + L'\xffffffff') * 4);
    uVar7 = Rand_div(0x640);
    if (bVar3) {
      if (local_state.el_info._92_8_ != 0) {
        *(undefined1 *)(local_state.el_info._92_8_ + 0x11a) = uVar1;
      }
      (player->body).slots[slot].obj = poVar8;
      calc_bonuses(player,(player_state_conflict *)&used_state,false,true);
    }
    if (((int)uVar7 < iVar2) && (_Var6 = twall(grid), _Var6)) {
      if (_Var5) {
        msg("You have removed the rubble %s.",local_190);
        uVar7 = Rand_div(100);
        if (((int)uVar7 < 10) && (player->depth != 0)) {
          place_object(cave,(loc)grid,(int)player->depth,false,false,'\b',L'\0');
          poVar8 = square_object((chunk *)cave,grid);
          p = player;
          if (poVar8 != (object *)0x0) {
            poVar8 = square_object((chunk *)cave,grid);
            _Var4 = ignore_item_ok(p,poVar8);
            if ((!_Var4) && (_Var4 = square_isseen((chunk *)cave,grid), _Var4)) {
              msg("You have found something!");
            }
          }
        }
      }
      else if (_Var4) {
        place_gold(cave,(loc)grid,(int)player->depth,'\x01');
        msg("You have found something digging %s!",local_190);
      }
      else {
        msg("You have finished the tunnel %s.",local_190);
      }
      c = cave;
      if (cave->depth == 0) {
        _Var4 = is_daytime();
        expose_to_sun((chunk *)c,(loc)grid,_Var4);
      }
      square_memorize((chunk *)cave,grid);
      square_light_spot((chunk *)cave,(loc)grid);
      player->upkeep->update = player->upkeep->update | 0x60;
    }
    else if (iVar2 < 1) {
      if (_Var5) {
        msg("You dig in the rubble %s with little effect.",local_190);
      }
      else {
        pcVar10 = square_apparent_name((chunk *)player->cave,grid);
        msg("You chip away futilely %s at the %s.",local_190,pcVar10);
      }
    }
    else {
      if (_Var5) {
        msg("You dig in the rubble %s.",local_190);
      }
      else {
        pcVar10 = square_apparent_name((chunk *)player->cave,grid);
        msg("You tunnel into the %s %s.",pcVar10,local_190);
      }
      grid_local.x._3_1_ = true;
    }
  }
  else {
    grid_local.x._3_1_ = false;
  }
  return grid_local.x._3_1_;
}

Assistant:

static bool do_cmd_tunnel_aux(struct loc grid)
{
	bool more = false;
	int digging_chances[DIGGING_MAX], chance;
	bool okay = false;
	bool gold = square_hasgoldvein(cave, grid);
	bool rubble = square_isrubble(cave, grid);
	bool digger_swapped = false;
	int weapon_slot = slot_by_name(player, "weapon");
	struct object *current_weapon = slot_object(player, weapon_slot);
	struct object *best_digger = NULL;
	struct player_state local_state;
	struct player_state *used_state = &player->state;
	int oldn = 1, dig_idx;
	const char *with_clause = current_weapon == NULL ? "with your hands" : "with your weapon";

	/* Verify legality */
	if (!do_cmd_tunnel_test(player, grid)) return (false);

	/* Find what we're digging with and our chance of success */
	best_digger = player_best_digger(player, false);
	if (best_digger != current_weapon &&
			(!current_weapon || obj_can_takeoff(current_weapon))) {
		digger_swapped = true;
		with_clause = "with your swap digger";
		/* Use only one without the overhead of gear_obj_for_use(). */
		if (best_digger) {
			oldn = best_digger->number;
			best_digger->number = 1;
		}
		player->body.slots[weapon_slot].obj = best_digger;
		memcpy(&local_state, &player->state, sizeof(local_state));
		calc_bonuses(player, &local_state, false, true);
		used_state = &local_state;
	}
	calc_digging_chances(used_state, digging_chances);

	/* Do we succeed? */
	dig_idx = square_digging(cave, grid);
	if (dig_idx < 1 || dig_idx > DIGGING_MAX) {
		msg("%s has misconfigured digging chance; please report this bug.",
			(square_feat(cave, grid)->name) ?
			square_feat(cave, grid)->name :
			format("Terrain index %d", square_feat(cave, grid)->fidx));
		dig_idx = DIGGING_GRANITE + 1;
	}
	chance = digging_chances[dig_idx - 1];
	okay = (chance > randint0(1600));

	/* Swap back */
	if (digger_swapped) {
		if (best_digger) {
			best_digger->number = oldn;
		}
		player->body.slots[weapon_slot].obj = current_weapon;
		calc_bonuses(player, &local_state, false, true);
	}

	/* Success */
	if (okay && twall(grid)) {
		/* Rubble is a special case - could be handled more generally NRM */
		if (rubble) {
			/* Message */
			msg("You have removed the rubble %s.", with_clause);

			/* Place an object (except in town) */
			if ((randint0(100) < 10) && player->depth) {
				/* Create a simple object */
				place_object(cave, grid, player->depth, false, false,
							 ORIGIN_RUBBLE, 0);

				/* Observe the new object */
				if (square_object(cave, grid)
						&& !ignore_item_ok(player,
						square_object(cave, grid))
						&& square_isseen(cave, grid)) {
					msg("You have found something!");
				}
			} 
		} else if (gold) {
			/* Found treasure */
			place_gold(cave, grid, player->depth, ORIGIN_FLOOR);
			msg("You have found something digging %s!", with_clause);
		} else {
			msg("You have finished the tunnel %s.", with_clause);
		}
		/* On the surface, new terrain may be exposed to the sun. */
		if (cave->depth == 0) expose_to_sun(cave, grid, is_daytime());
		/* Update the visuals. */
		square_memorize(cave, grid);
		square_light_spot(cave, grid);
		player->upkeep->update |= (PU_UPDATE_VIEW | PU_MONSTERS);
	} else if (chance > 0) {
		/* Failure, continue digging */
		if (rubble)
			msg("You dig in the rubble %s.", with_clause);
		else
			msg("You tunnel into the %s %s.",
				square_apparent_name(player->cave, grid), with_clause);
		more = true;
	} else {
		/* Don't automatically repeat if there's no hope. */
		if (rubble) {
			msg("You dig in the rubble %s with little effect.", with_clause);
		} else {
			msg("You chip away futilely %s at the %s.", with_clause,
				square_apparent_name(player->cave, grid));
		}
	}

	/* Result */
	return (more);
}